

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickpool.hpp
# Opt level: O0

RingBuffer<std::function<void_()>_*> * __thiscall
quickpool::sched::RingBuffer<std::function<void_()>_*>::enlarged_copy
          (RingBuffer<std::function<void_()>_*> *this,size_t bottom,size_t top)

{
  RingBuffer<std::function<void_()>_*> *this_00;
  function<void_()> *val;
  size_t local_40;
  size_t i;
  RingBuffer<std::function<void_()>_*> *new_buffer;
  size_t top_local;
  size_t bottom_local;
  RingBuffer<std::function<void_()>_*> *this_local;
  
  this_00 = (RingBuffer<std::function<void_()>_*> *)operator_new(0x18);
  RingBuffer(this_00,this->capacity_ * 2);
  for (local_40 = top; local_40 != bottom; local_40 = local_40 + 1) {
    val = get_entry(this,local_40);
    set_entry(this_00,local_40,val);
  }
  return this_00;
}

Assistant:

RingBuffer<T>* enlarged_copy(size_t bottom, size_t top) const
    {
        RingBuffer<T>* new_buffer = new RingBuffer{ 2 * capacity_ };
        for (size_t i = top; i != bottom; ++i)
            new_buffer->set_entry(i, this->get_entry(i));
        return new_buffer;
    }